

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O1

ssize_t __thiscall
sc_core::wif_sc_signed_trace::write(wif_sc_signed_trace *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  sc_signed_bitref_r *this_00;
  uint64 uVar4;
  sc_signed *psVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  int iVar7;
  pointer pcVar8;
  allocator_type local_4a;
  value_type_conflict local_49;
  vector<char,_std::allocator<char>_> local_48;
  
  if (write(_IO_FILE*)::buf == '\0') {
    iVar7 = __cxa_guard_acquire(&write(_IO_FILE*)::buf);
    if (iVar7 != 0) {
      write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x400);
      pcVar8 = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x400;
      write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar8;
      memset(write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x400);
      write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar8;
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::buf,&__dso_handle);
      __cxa_guard_release(&write(_IO_FILE*)::buf);
    }
  }
  uVar6 = (ulong)this->object->nbits;
  if ((ulong)((long)write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= uVar6) {
    local_49 = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              (&local_48,(uVar6 & 0xfffffffffffff000) + 0x1000,&local_49,&local_4a);
    pcVar3 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar2 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar8 = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar1;
    write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
    write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar3;
    if (pcVar8 != (pointer)0x0) {
      operator_delete(pcVar8);
    }
  }
  iVar7 = this->object->nbits;
  pcVar8 = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < iVar7) {
    iVar7 = iVar7 + 1;
    do {
      this_00 = sc_dt::sc_signed::operator[](this->object,iVar7 + -2);
      uVar4 = sc_dt::sc_signed_bitref_r::operator_cast_to_unsigned_long_long(this_00);
      *pcVar8 = "01"[uVar4 != 0];
      pcVar8 = pcVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  *pcVar8 = '\0';
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \"%s\" ;\n",
          (this->super_wif_trace).wif_name._M_dataplus._M_p,
          write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start);
  psVar5 = sc_dt::sc_signed::operator=(&this->old_value,this->object);
  return (ssize_t)psVar5;
}

Assistant:

void wif_sc_signed_trace::write(FILE* f)
{
    static std::vector<char> buf(1024);
    typedef std::vector<char>::size_type size_t;

    if ( buf.size() <= static_cast<size_t>(object.length()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.length()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( buf ); // resize without copying values
    }
    char *buf_ptr = &buf[0];

    for(int bitindex = object.length() - 1; bitindex >= 0; --bitindex) {
        *buf_ptr++ = "01"[object[bitindex].to_bool()];
    }
    *buf_ptr = '\0';

    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), &buf[0]);
    old_value = object;
}